

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allow.cpp
# Opt level: O0

string * cappuccino::to_string_abi_cxx11_(allow a)

{
  allow a_local;
  
  if (a == insert) {
    a_local = (allow)allow_insert_abi_cxx11_;
  }
  else if (a == update) {
    a_local = (allow)allow_update_abi_cxx11_;
  }
  else if (a == insert_or_update) {
    a_local = (allow)allow_insert_or_update_abi_cxx11_;
  }
  else {
    a_local = (allow)allow_invalid_value_abi_cxx11_;
  }
  return (string *)a_local;
}

Assistant:

auto to_string(allow a) -> const std::string&
{
    switch (a)
    {
        case allow::insert_or_update:
            return allow_insert_or_update;
        case allow::insert:
            return allow_insert;
        case allow::update:
            return allow_update;
        default:
            return allow_invalid_value;
    }
}